

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QUnicodeTables::convertCase<QString>(QString *str,Case which)

{
  bool bVar1;
  char32_t ucs4;
  const_iterator begin;
  qsizetype qVar2;
  Properties *pPVar3;
  uint in_EDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  char32_t uc;
  QChar *e;
  QStringIterator in_stack_00000040;
  QChar *p;
  QStringIterator it;
  QString *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  QStringIterator *in_stack_ffffffffffffff68;
  QStringIterator *in_stack_ffffffffffffff70;
  bool local_81;
  QChar *local_60;
  QStringIterator local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  begin = QString::constBegin((QString *)0x1502cd);
  qVar2 = QString::size(in_RSI);
  local_60 = begin + qVar2;
  while( true ) {
    local_81 = false;
    if (local_60 != begin) {
      local_81 = QChar::isHighSurrogate((QChar *)0x150319);
    }
    if (local_81 == false) break;
    local_60 = local_60 + -1;
  }
  local_20.i = (const_iterator)0xaaaaaaaaaaaaaaaa;
  local_20.pos = (const_iterator)0xaaaaaaaaaaaaaaaa;
  local_20.e = (const_iterator)0xaaaaaaaaaaaaaaaa;
  QStringIterator::QStringIterator(&local_20,begin,local_60);
  do {
    bVar1 = QStringIterator::hasNext((QStringIterator *)0x150388);
    if (!bVar1) {
      QString::QString(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      goto LAB_00150440;
    }
    ucs4 = QStringIterator::next
                     (in_stack_ffffffffffffff68,(char32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20)
                     );
    pPVar3 = qGetProp(ucs4);
  } while ((short)pPVar3->cases[in_EDX] >> 1 == 0);
  QStringIterator::recede(in_stack_ffffffffffffff70);
  detachAndConvertCase<QString>
            ((QString *)local_20.e,in_stack_00000040,(Case)((ulong)local_20.pos >> 0x20));
LAB_00150440:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QString convertCase(T &str, QUnicodeTables::Case which)
{
    const QChar *p = str.constBegin();
    const QChar *e = p + str.size();

    // this avoids out of bounds check in the loop
    while (e != p && e[-1].isHighSurrogate())
        --e;

    QStringIterator it(p, e);
    while (it.hasNext()) {
        const char32_t uc = it.next();
        if (qGetProp(uc)->cases[which].diff) {
            it.recede();
            return detachAndConvertCase(str, it, which);
        }
    }
    return std::move(str);
}